

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

void __thiscall
ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::basic_ofstream
          (basic_ofstream<char,_std::char_traits<char>_> *this,path *p,openmode mode)

{
  string local_40;
  
  std::ios::ios((ios *)&(this->super_basic_ofstream<char,_std::char_traits<char>_>).
                        super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  path::string_abi_cxx11_(&local_40,p);
  std::ofstream::ofstream
            ((ofstream *)this,(char *)&PTR_construction_vtable_24__001b4728,
             (_Ios_Openmode)local_40._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_basic_ofstream<char,_std::char_traits<char>_>).
  super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream = (_func_int **)0x1b46e8;
  *(undefined8 *)
   &(this->super_basic_ofstream<char,_std::char_traits<char>_>).
    super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8 = 0x1b4710;
  return;
}

Assistant:

explicit basic_ofstream(const path& p, std::ios_base::openmode mode = std::ios_base::out)
        : std::basic_ofstream<charT, traits>(p.string().c_str(), mode)
    {
    }